

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O0

FRemapTable * __thiscall FRemapTable::operator=(FRemapTable *this,FRemapTable *o)

{
  FRemapTable *o_local;
  FRemapTable *this_local;
  
  if (o != this) {
    if (o->NumEntries != this->NumEntries) {
      Free(this);
    }
    if (this->Remap == (BYTE *)0x0) {
      Alloc(this,o->NumEntries);
    }
    this->Inactive = (bool)(o->Inactive & 1);
    memcpy(this->Remap,o->Remap,(long)this->NumEntries + (long)this->NumEntries * 4);
  }
  return this;
}

Assistant:

FRemapTable &FRemapTable::operator=(const FRemapTable &o)
{
	if (&o == this)
	{
		return *this;
	}
	if (o.NumEntries != NumEntries)
	{
		Free();
	}
	if (Remap == NULL)
	{
		Alloc(o.NumEntries);
	}
	Inactive = o.Inactive;
	memcpy(Remap, o.Remap, NumEntries*sizeof(*Remap) + NumEntries*sizeof(*Palette));
	return *this;
}